

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O2

int32_t uprv_compareInvEbcdicAsAscii_63(char *s1,char *s2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  lVar4 = 0;
  while( true ) {
    bVar1 = s1[lVar4];
    bVar2 = s2[lVar4];
    if (bVar1 != bVar2) {
      uVar5 = 0;
      uVar6 = 0;
      if (bVar1 != 0) {
        bVar3 = ""[bVar1];
        uVar6 = (uint)bVar3;
        if ((bVar3 == 0) || ((invariantChars[bVar3 >> 5] >> (bVar3 & 0x1f) & 1) == 0)) {
          uVar6 = -(uint)bVar1;
        }
      }
      if ((ulong)bVar2 != 0) {
        bVar1 = ""[bVar2];
        uVar5 = (uint)bVar1;
        if ((bVar1 == 0) || ((invariantChars[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0)) {
          uVar5 = -(uint)bVar2;
        }
      }
      return uVar6 - uVar5;
    }
    if ((ulong)bVar1 == 0) break;
    lVar4 = lVar4 + 1;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_compareInvEbcdicAsAscii(const char *s1, const char *s2) {
    int32_t c1, c2;

    for(;; ++s1, ++s2) {
        c1=(uint8_t)*s1;
        c2=(uint8_t)*s2;
        if(c1!=c2) {
            if(c1!=0 && ((c1=asciiFromEbcdic[c1])==0 || !UCHAR_IS_INVARIANT(c1))) {
                c1=-(int32_t)(uint8_t)*s1;
            }
            if(c2!=0 && ((c2=asciiFromEbcdic[c2])==0 || !UCHAR_IS_INVARIANT(c2))) {
                c2=-(int32_t)(uint8_t)*s2;
            }
            return c1-c2;
        } else if(c1==0) {
            return 0;
        }
    }
}